

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_0::ShardedLRUCache::Erase(ShardedLRUCache *this,Slice *key)

{
  uint32_t hash_00;
  uint32_t uVar1;
  uint32_t hash;
  Slice *key_local;
  ShardedLRUCache *this_local;
  
  hash_00 = HashSlice(key);
  uVar1 = Shard(hash_00);
  LRUCache::Erase(this->shard_ + uVar1,key,hash_00);
  return;
}

Assistant:

void Erase(const Slice& key) override {
    const uint32_t hash = HashSlice(key);
    shard_[Shard(hash)].Erase(key, hash);
  }